

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_symmetr.c
# Opt level: O0

void gai_add(Integer *lo,Integer *hi,void *a,void *b,DoublePrecision alpha,Integer type,
            Integer nelem,Integer ndim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long local_90;
  long local_88;
  Integer offset2;
  Integer offset1;
  DoublePrecision *B;
  DoublePrecision *A;
  Integer indexB;
  Integer indexA;
  Integer ncol;
  Integer nrow;
  Integer m;
  Integer j;
  Integer i;
  Integer nelem_local;
  Integer type_local;
  DoublePrecision alpha_local;
  void *b_local;
  void *a_local;
  
  local_88 = 1;
  local_90 = 1;
  lVar3 = (hi[ndim + -2] - lo[ndim + -2]) + 1;
  lVar1 = hi[ndim + -1];
  lVar2 = lo[ndim + -1];
  for (m = 0; m < ndim + -2; m = m + 1) {
    local_88 = ((hi[m] - lo[m]) + 1) * local_88;
    local_90 = ((hi[m] - lo[m]) + 1) * local_90;
  }
  for (nrow = 0; ncol = 0, nrow < local_90; nrow = nrow + 1) {
    B = (DoublePrecision *)nrow;
    A = (DoublePrecision *)nrow;
    for (m = 0; m < lVar3 * ((lVar1 - lVar2) + 1); m = m + 1) {
      if (nelem <= (long)A) {
        ncol = ncol + 1;
        A = (DoublePrecision *)(nrow + ncol * local_90);
      }
      *(double *)((long)a + (long)A * 8) =
           alpha * (*(double *)((long)a + (long)A * 8) + *(double *)((long)b + (long)B * 8));
      A = (DoublePrecision *)(lVar3 * local_88 + (long)A);
      B = (DoublePrecision *)(local_90 + (long)B);
    }
  }
  return;
}

Assistant:

static void gai_add(
        Integer *lo, Integer *hi, void *a, void *b, DoublePrecision alpha,
        Integer type, Integer nelem, Integer ndim)
{
  Integer i, j, m=0;
  Integer nrow, ncol, indexA=0, indexB=0;
  DoublePrecision *A = (DoublePrecision *)a, *B = (DoublePrecision*)b;
  Integer offset1=1, offset2=1;

  nrow = hi[ndim-2] - lo[ndim-2] + 1;
  ncol = hi[ndim-1] - lo[ndim-1] + 1;
  
  for(i=0; i<ndim-2; i++) {
    offset1 *= hi[i] - lo[i] + 1;
    offset2 *= hi[i] - lo[i] + 1;
  }
  offset1 *= nrow;
  
  for(j=0; j<offset2; ++j,indexA=j,indexB=j,m=0) {
    for(i=0; i<nrow*ncol; i++, indexA += offset1, indexB += offset2) {
      if(indexA >= nelem) indexA = j + ++m*offset2;
      A[indexA] = alpha *(A[indexA] + B[indexB]);
    }
  }
}